

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O3

bool embree::intersect_triangle_triangle(uint geomID0,uint primID0,uint geomID1,uint primID1)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vec3fa b2;
  Vec3fa b1;
  Vec3fa b0;
  Vec3fa a2;
  Vec3fa a1;
  Vec3fa a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  if (primID0 != primID1 || geomID0 != geomID1) {
    lVar4 = *(long *)(meshes + (ulong)geomID1 * 8);
    lVar5 = *(long *)(meshes + (ulong)geomID0 * 8);
    lVar6 = *(long *)(lVar5 + 0x20);
    uVar2 = *(undefined8 *)(lVar6 + (ulong)primID0 * 0xc);
    iVar13 = (int)uVar2;
    iVar14 = (int)((ulong)uVar2 >> 0x20);
    iVar3 = *(int *)(lVar6 + 8 + (ulong)primID0 * 0xc);
    piVar12 = (int *)((ulong)primID1 * 0xc + *(long *)(lVar4 + 0x20));
    if (geomID0 != geomID1) {
      iVar8 = *piVar12;
      iVar9 = piVar12[1];
      iVar10 = piVar12[2];
LAB_00119dfb:
      lVar5 = *(long *)(lVar5 + 8);
      puVar1 = (undefined8 *)(lVar5 + (long)iVar13 * 0x10);
      local_18._0_8_ = *puVar1;
      local_18._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar5 + (long)iVar14 * 0x10);
      local_28._0_8_ = *puVar1;
      local_28._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar5 + (long)iVar3 * 0x10);
      local_38._0_8_ = *puVar1;
      local_38._8_8_ = puVar1[1];
      lVar4 = *(long *)(lVar4 + 8);
      puVar1 = (undefined8 *)(lVar4 + (long)iVar8 * 0x10);
      local_48._0_8_ = *puVar1;
      local_48._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar4 + (long)iVar9 * 0x10);
      local_58._0_8_ = *puVar1;
      local_58._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar4 + (long)iVar10 * 0x10);
      local_68._0_8_ = *puVar1;
      local_68._8_8_ = puVar1[1];
      bVar7 = sse2::TriangleTriangleIntersector::intersect_triangle_triangle
                        ((Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,
                         (Vec3fa *)&local_38.field_1,(Vec3fa *)&local_48.field_1,
                         (Vec3fa *)&local_58.field_1,(Vec3fa *)&local_68.field_1);
      return bVar7;
    }
    iVar8 = *piVar12;
    auVar15._0_4_ = -(uint)(iVar8 == iVar13);
    auVar15._4_4_ = -(uint)(iVar8 == iVar14);
    auVar15._8_4_ = -(uint)(iVar8 == iVar3);
    auVar15._12_4_ = -(uint)(iVar8 == iVar3);
    iVar9 = movmskps(geomID1,auVar15);
    if (iVar9 == 0) {
      iVar9 = piVar12[1];
      auVar16._0_4_ = -(uint)(iVar9 == iVar13);
      auVar16._4_4_ = -(uint)(iVar9 == iVar14);
      auVar16._8_4_ = -(uint)(iVar9 == iVar3);
      auVar16._12_4_ = -(uint)(iVar9 == iVar3);
      iVar10 = movmskps(0,auVar16);
      if (iVar10 == 0) {
        iVar10 = piVar12[2];
        auVar17._0_4_ = -(uint)(iVar10 == iVar13);
        auVar17._4_4_ = -(uint)(iVar10 == iVar14);
        auVar17._8_4_ = -(uint)(iVar10 == iVar3);
        auVar17._12_4_ = -(uint)(iVar10 == iVar3);
        iVar11 = movmskps(0,auVar17);
        if (iVar11 == 0) goto LAB_00119dfb;
      }
    }
  }
  return false;
}

Assistant:

bool intersect_triangle_triangle (unsigned geomID0, unsigned primID0, unsigned geomID1, unsigned primID1)
{
  //CSTAT(bvh_collide_prim_intersections1++);
  
  /* special culling for scene intersection with itself */
  if (geomID0 == geomID1 && primID0 == primID1) {
    return false;
  }
  //CSTAT(bvh_collide_prim_intersections2++);

  auto mesh0 = meshes[geomID0].get ();
  auto mesh1 = meshes[geomID1].get ();
  auto const & tri0 = (Triangle&) mesh0->tris_[primID0];
  auto const & tri1 = (Triangle&) mesh1->tris_[primID1];
  
  if (geomID0 == geomID1)
  {
    /* ignore intersection with topological neighbors */
    const vint4 t0(tri0.v0,tri0.v1,tri0.v2,tri0.v2);
    if (any(vint4(tri1.v0) == t0)) return false;
    if (any(vint4(tri1.v1) == t0)) return false;
    if (any(vint4(tri1.v2) == t0)) return false;
  }
  //CSTAT(bvh_collide_prim_intersections3++);
  
  const Vec3fa a0 = mesh0->x_[tri0.v0];
  const Vec3fa a1 = mesh0->x_[tri0.v1];
  const Vec3fa a2 = mesh0->x_[tri0.v2];
  const Vec3fa b0 = mesh1->x_[tri1.v0];
  const Vec3fa b1 = mesh1->x_[tri1.v1];
  const Vec3fa b2 = mesh1->x_[tri1.v2];
  
  return isa::TriangleTriangleIntersector::intersect_triangle_triangle(a0,a1,a2,b0,b1,b2);
}